

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Location.cpp
# Opt level: O2

string * Location::get_location(string *__return_storage_ptr__,string *ip_addr)

{
  reference pvVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_208;
  key_type local_1e8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  response;
  _Head_base<0UL,_httplib::ClientImpl_*,_false> local_1b8;
  float local_1b0;
  float local_1ac;
  Result res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string continent;
  string rs;
  string zip;
  string city;
  string region_name;
  string country;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string address;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  _Alloc_hider local_28;
  size_type sStack_20;
  
  httplib::Client::Client((Client *)&local_1b8,"http://api.ipstack.com");
  std::operator+(&continent,"/",ip_addr);
  std::operator+(&rs,&continent,"?access_key=");
  std::operator+(&address,&rs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ipStackAccessKey_abi_cxx11_);
  std::__cxx11::string::~string((string *)&rs);
  std::__cxx11::string::~string((string *)&continent);
  httplib::ClientImpl::Get((ClientImpl *)&res,(char *)local_1b8._M_head_impl);
  if ((__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)
      res.res_._M_t.
      super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
      super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
      super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0) {
    if (*(int *)((long)res.res_._M_t.
                       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                       .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20) ==
        200) {
      std::__cxx11::string::string
                ((string *)&rs,
                 (string *)
                 ((long)res.res_._M_t.
                        super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                        .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78));
      local_38._M_allocated_capacity = 0;
      local_38._8_8_ = 0;
      local_28._M_p = (pointer)0x0;
      sStack_20 = 0;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::parse<std::__cxx11::string&>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&response,&rs,(parser_callback_t *)&local_38,true,false);
      std::_Function_base::~_Function_base((_Function_base *)&local_38);
      continent._M_dataplus._M_p = (pointer)&continent.field_2;
      continent._M_string_length = 0;
      country._M_dataplus._M_p = (pointer)&country.field_2;
      country._M_string_length = 0;
      continent.field_2._M_local_buf[0] = '\0';
      country.field_2._M_local_buf[0] = '\0';
      region_name._M_dataplus._M_p = (pointer)&region_name.field_2;
      region_name._M_string_length = 0;
      city._M_dataplus._M_p = (pointer)&city.field_2;
      city._M_string_length = 0;
      region_name.field_2._M_local_buf[0] = '\0';
      city.field_2._M_local_buf[0] = '\0';
      zip._M_dataplus._M_p = (pointer)&zip.field_2;
      zip._M_string_length = 0;
      zip.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"continent_name",(allocator<char> *)&local_198);
      pvVar1 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&response,&local_1e8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&bStack_208,pvVar1);
      std::__cxx11::string::operator=((string *)&continent,(string *)&bStack_208);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"country_name",(allocator<char> *)&local_198);
      pvVar1 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&response,&local_1e8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&bStack_208,pvVar1);
      std::__cxx11::string::operator=((string *)&country,(string *)&bStack_208);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"region_name",(allocator<char> *)&local_198);
      pvVar1 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&response,&local_1e8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&bStack_208,pvVar1);
      std::__cxx11::string::operator=((string *)&region_name,(string *)&bStack_208);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"city",(allocator<char> *)&local_198);
      pvVar1 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&response,&local_1e8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&bStack_208,pvVar1);
      std::__cxx11::string::operator=((string *)&city,(string *)&bStack_208);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"zip",(allocator<char> *)&local_198);
      pvVar1 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&response,&local_1e8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&bStack_208,pvVar1);
      std::__cxx11::string::operator=((string *)&zip,(string *)&bStack_208);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_208,"latitude",(allocator<char> *)&local_1e8);
      pvVar1 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&response,&bStack_208);
      local_1ac = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get<float,_float,_0>(pvVar1);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_208,"longitude",(allocator<char> *)&local_1e8);
      pvVar1 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&response,&bStack_208);
      local_1b0 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get<float,_float,_0>(pvVar1);
      std::__cxx11::string::~string((string *)&bStack_208);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&bStack_208,&city,", ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::operator+(&bStack_208,&region_name,", ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::operator+(&bStack_208,&country,", ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::operator+(&bStack_208,&continent,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::operator+(&bStack_208,"Zip: ",&zip);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::__cxx11::to_string(&local_98,local_1ac);
      std::operator+(&local_78,", Coordinates: ",&local_98);
      std::operator+(&local_198,&local_78,",");
      std::__cxx11::to_string(&local_b8,local_1b0);
      std::operator+(&local_1e8,&local_198,&local_b8);
      std::operator+(&bStack_208,&local_1e8,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&zip);
      std::__cxx11::string::~string((string *)&city);
      std::__cxx11::string::~string((string *)&region_name);
      std::__cxx11::string::~string((string *)&country);
      std::__cxx11::string::~string((string *)&continent);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&response);
      std::__cxx11::string::~string((string *)&rs);
      std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
                (&res.res_);
      goto LAB_00108d79;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Error Fetching IP, Status Code ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,*(int *)((long)res.res_._M_t.
                                              super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                                              .super__Head_base<0UL,_httplib::Response_*,_false>.
                                              _M_head_impl + 0x20));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            (&res.res_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Cannot Determine Location",(allocator<char> *)&rs);
LAB_00108d79:
  std::__cxx11::string::~string((string *)&address);
  if (local_1b8._M_head_impl != (ClientImpl *)0x0) {
    (*(local_1b8._M_head_impl)->_vptr_ClientImpl[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Location::get_location(const std::string &ip_addr) {
	httplib::Client client("http://api.ipstack.com");
	std::string address = "/" + ip_addr + "?access_key=" + Location::ipStackAccessKey;

	if (auto res = client.Get(address.c_str())) {
		if (res->status == 200) {
			std::string rs = res->body;
			auto response = nlohmann::json::parse(rs);

			std::string continent, country, region_name, city, zip;
			float latitude, longitude;

			try {
				continent = response.at("continent_name");
				country = response.at("country_name");
				region_name = response.at("region_name");
				city = response.at("city");
				zip = response.at("zip");
				latitude = response.at("latitude");
				longitude = response.at("longitude");
			} catch (...) {
				// do nothing, let the particular string be empty
			}

			std::string result;
			result += "Location: ";
			result += city + ", ";
			result += region_name + ", ";
			result += country + ", ";
			result += continent + "\n";
			result += "Zip: " + zip;
			result += ", Coordinates: " + std::to_string(latitude) + "," + std::to_string(longitude) + "\n";

			return result;

		} else {
			std::cout << "Error Fetching IP, Status Code " << res->status << std::endl;
		}
	}

	return "Cannot Determine Location";
}